

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O3

string * __thiscall
spirv_cross::extract_string_abi_cxx11_
          (string *__return_storage_ptr__,spirv_cross *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,uint32_t offset)

{
  string *psVar1;
  runtime_error *this_00;
  uint uVar2;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  
  uVar4 = (ulong)spirv & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = *(string **)this;
  if (((ulong)spirv & 0xffffffff) < (ulong)(*(long *)(this + 8) - (long)psVar1 >> 2)) {
    do {
      uVar2 = *(uint *)((long)&(psVar1->_M_dataplus)._M_p + uVar4 * 4);
      iVar3 = 4;
      do {
        if ((char)uVar2 == '\0') {
          return psVar1;
        }
        psVar1 = (string *)::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = uVar2 >> 8;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      uVar4 = (ulong)((int)uVar4 + 1);
      psVar1 = *(string **)this;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - (long)psVar1 >> 2));
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"String was not terminated before EOF");
  *(undefined ***)this_00 = &PTR__runtime_error_003a2f80;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string extract_string(const vector<uint32_t> &spirv, uint32_t offset)
{
	string ret;
	for (uint32_t i = offset; i < spirv.size(); i++)
	{
		uint32_t w = spirv[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			char c = w & 0xff;
			if (c == '\0')
				return ret;
			ret += c;
		}
	}

	SPIRV_CROSS_THROW("String was not terminated before EOF");
}